

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_libinfo.c
# Opt level: O2

CURLcode get_libcurl_info(void)

{
  char **ppcVar1;
  int iVar2;
  CURLcode CVar3;
  char **cpp;
  char **ppcVar4;
  feature_name_presentp *p;
  feature_name_presentp *pfVar5;
  char ***pppcVar6;
  _Bool **pp_Var7;
  
  curlinfo = (curl_version_info_data *)curl_version_info(0xb);
  if (curlinfo == (curl_version_info_data *)0x0) {
    CVar3 = CURLE_FAILED_INIT;
  }
  else {
    ppcVar4 = curlinfo->protocols;
    ppcVar1 = ppcVar4;
    if (ppcVar4 != (char **)0x0) {
      for (; built_in_protos = ppcVar1, *ppcVar4 != (char *)0x0; ppcVar4 = ppcVar4 + 1) {
        for (pppcVar6 = &possibly_built_in[0].proto_tokenp;
            ((proto_name_tokenp *)(pppcVar6 + -1))->proto_name != (char *)0x0;
            pppcVar6 = pppcVar6 + 2) {
          iVar2 = curl_strequal(((proto_name_tokenp *)(pppcVar6 + -1))->proto_name,*ppcVar4);
          if (iVar2 != 0) {
            **pppcVar6 = *ppcVar4;
            break;
          }
        }
        ppcVar1 = built_in_protos;
      }
      proto_count = (long)ppcVar4 - (long)built_in_protos >> 3;
    }
    if ((curlinfo->age < CURLVERSION_ELEVENTH) ||
       (ppcVar4 = curlinfo->feature_names, ppcVar1 = ppcVar4, ppcVar4 == (char **)0x0)) {
      ppcVar4 = fnames;
      for (pfVar5 = maybe_feature; pfVar5->feature_name != (char *)0x0; pfVar5 = pfVar5 + 1) {
        if ((curlinfo->features & pfVar5->feature_bitmask) != 0) {
          *ppcVar4 = pfVar5->feature_name;
          ppcVar4 = ppcVar4 + 1;
        }
      }
      *ppcVar4 = (char *)0x0;
      ppcVar4 = feature_names;
      ppcVar1 = feature_names;
    }
    for (; feature_names = ppcVar1, *ppcVar4 != (char *)0x0; ppcVar4 = ppcVar4 + 1) {
      for (pp_Var7 = &maybe_feature[0].feature_presentp;
          ((feature_name_presentp *)(pp_Var7 + -1))->feature_name != (char *)0x0;
          pp_Var7 = pp_Var7 + 3) {
        iVar2 = curl_strequal(((feature_name_presentp *)(pp_Var7 + -1))->feature_name,*ppcVar4);
        if (iVar2 != 0) {
          if (*pp_Var7 != (_Bool *)0x0) {
            **pp_Var7 = true;
          }
          break;
        }
      }
      feature_count = feature_count + 1;
      ppcVar1 = feature_names;
    }
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode get_libcurl_info(void)
{
  CURLcode result = CURLE_OK;
  const char *const *builtin;

  /* Pointer to libcurl's runtime version information */
  curlinfo = curl_version_info(CURLVERSION_NOW);
  if(!curlinfo)
    return CURLE_FAILED_INIT;

  if(curlinfo->protocols) {
    const struct proto_name_tokenp *p;

    built_in_protos = curlinfo->protocols;

    for(builtin = built_in_protos; !result && *builtin; builtin++) {
      /* Identify protocols we are interested in. */
      for(p = possibly_built_in; p->proto_name; p++)
        if(curl_strequal(p->proto_name, *builtin)) {
          *p->proto_tokenp = *builtin;
          break;
        }
    }
    proto_count = builtin - built_in_protos;
  }

  if(curlinfo->age >= CURLVERSION_ELEVENTH && curlinfo->feature_names)
    feature_names = curlinfo->feature_names;
  else {
    const struct feature_name_presentp *p;
    const char **cpp = fnames;

    for(p = maybe_feature; p->feature_name; p++)
      if(curlinfo->features & p->feature_bitmask)
        *cpp++ = p->feature_name;
    *cpp = NULL;
  }

  /* Identify features we are interested in. */
  for(builtin = feature_names; *builtin; builtin++) {
    const struct feature_name_presentp *p;

    for(p = maybe_feature; p->feature_name; p++)
      if(curl_strequal(p->feature_name, *builtin)) {
        if(p->feature_presentp)
          *p->feature_presentp = TRUE;
        break;
      }
    ++feature_count;
  }

  return CURLE_OK;
}